

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O3

QList<QCss::StyleRule> * __thiscall
QCss::StyleSelector::styleRulesForNode
          (QList<QCss::StyleRule> *__return_storage_ptr__,StyleSelector *this,NodePtr node)

{
  byte bVar1;
  StyleSheet *pSVar2;
  Entry *pEVar3;
  long *plVar4;
  Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *pDVar5;
  Chain **ppCVar6;
  Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *pDVar7;
  size_t sVar8;
  char cVar9;
  storage_type_conflict *psVar10;
  MediaRule *pMVar11;
  totally_ordered_wrapper<QMapData<std::multimap<unsigned_int,_QCss::StyleRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QCss::StyleRule>_>_>_>_*>
  tVar12;
  QMultiMap<unsigned_int,_QCss::StyleRule> QVar13;
  ulong uVar14;
  QMapData<std::multimap<unsigned_int,_QCss::StyleRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QCss::StyleRule>_>_>_>
  *pQVar15;
  long lVar16;
  undefined1 *puVar17;
  QString *key;
  _Base_ptr asize;
  ulong uVar18;
  ulong uVar19;
  long in_FS_OFFSET;
  QStringView QVar20;
  QStringView QVar21;
  QStringView QVar22;
  QStringView QVar23;
  QStringView QVar24;
  const_iterator local_98;
  const_iterator local_78;
  QArrayDataPointer<QString> local_58;
  QMultiMap<unsigned_int,_QCss::StyleRule> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (StyleRule *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if ((this->styleSheets).d.size != 0) {
    local_40.d.d.ptr =
         (QExplicitlySharedDataPointerV2<QMapData<std::multimap<unsigned_int,_QCss::StyleRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QCss::StyleRule>_>_>_>_>
          )(totally_ordered_wrapper<QMapData<std::multimap<unsigned_int,_QCss::StyleRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QCss::StyleRule>_>_>_>_*>
            )0x0;
    uVar14 = 0;
    do {
      pSVar2 = (this->styleSheets).d.ptr;
      if (pSVar2[uVar14].styleRules.d.size != 0) {
        lVar16 = 0;
        uVar18 = 0;
        do {
          matchRule(this,node,
                    (StyleRule *)
                    ((long)&((pSVar2[uVar14].styleRules.d.ptr)->selectors).d.d + lVar16),
                    pSVar2[uVar14].origin,pSVar2[uVar14].depth,&local_40);
          uVar18 = uVar18 + 1;
          lVar16 = lVar16 + 0x38;
        } while (uVar18 < (ulong)pSVar2[uVar14].styleRules.d.size);
      }
      if (pSVar2[uVar14].idIndex.m_size != 0) {
        local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d._0_4_ = 0xaaaaaaaa;
        local_58.d._4_4_ = 0xaaaaaaaa;
        local_58.ptr._0_4_ = 0xaaaaaaaa;
        local_58.ptr._4_4_ = 0xaaaaaaaa;
        (*this->_vptr_StyleSelector[5])(&local_58,this,node.ptr);
        if ((undefined1 *)local_58.size != (undefined1 *)0x0) {
          puVar17 = (undefined1 *)0x0;
          do {
            key = (QString *)
                  ((long)puVar17 * 0x18 + CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_));
            local_78.e = (Chain **)&DAT_aaaaaaaaaaaaaaaa;
            local_78.i.d = (Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *)
                           &DAT_aaaaaaaaaaaaaaaa;
            local_78.i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
            QMultiHash<QString,_QCss::StyleRule>::constFindImpl<QString>
                      (&local_78,&pSVar2[uVar14].idIndex,key);
LAB_005e0995:
            ppCVar6 = local_78.e;
            if (local_78.e != (Chain **)0x0) {
              pEVar3 = (local_78.i.d)->spans[local_78.i.bucket >> 7].entries;
              bVar1 = (local_78.i.d)->spans[local_78.i.bucket >> 7].offsets
                      [(uint)local_78.i.bucket & 0x7f];
              lVar16 = *(long *)(pEVar3[bVar1].storage.data + 0x10);
              if ((lVar16 != (key->d).size) ||
                 (QVar20.m_data = *(storage_type_conflict **)(pEVar3[bVar1].storage.data + 8),
                 QVar20.m_size = lVar16, QVar23.m_data = (key->d).ptr, QVar23.m_size = lVar16,
                 cVar9 = QtPrivate::equalStrings(QVar20,QVar23), cVar9 == '\0')) goto LAB_005e0ab6;
              matchRule(this,node,&(*ppCVar6)->value,pSVar2[uVar14].origin,pSVar2[uVar14].depth,
                        &local_40);
              lVar16 = (long)*local_78.e;
              local_78.e = (Chain **)(lVar16 + 0x38);
              if (*(long *)(lVar16 + 0x38) == 0) {
                psVar10 = (storage_type_conflict *)local_78.i.bucket;
                do {
                  local_78.i.bucket = (long)psVar10 + 1;
                  if ((storage_type_conflict *)((local_78.i.d)->numBuckets - 1) == psVar10) {
                    local_78.i.d = (Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *)0x0;
                    local_78.i.bucket = 0;
                    local_78.e = (Chain **)0x0;
                    goto LAB_005e0995;
                  }
                  uVar18 = local_78.i.bucket >> 7;
                  psVar10 = (storage_type_conflict *)local_78.i.bucket;
                } while ((local_78.i.d)->spans[uVar18].offsets[(uint)local_78.i.bucket & 0x7f] ==
                         0xff);
                local_78.e = (Chain **)
                             ((local_78.i.d)->spans[uVar18].entries
                              [(local_78.i.d)->spans[uVar18].offsets[(uint)local_78.i.bucket & 0x7f]
                              ].storage.data + 0x18);
              }
              goto LAB_005e0995;
            }
LAB_005e0ab6:
            puVar17 = puVar17 + 1;
          } while (puVar17 < (ulong)local_58.size);
        }
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
      }
      if (pSVar2[uVar14].nameIndex.m_size != 0) {
        local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d._0_4_ = 0xaaaaaaaa;
        local_58.d._4_4_ = 0xaaaaaaaa;
        local_58.ptr._0_4_ = 0xaaaaaaaa;
        local_58.ptr._4_4_ = 0xaaaaaaaa;
        (*this->_vptr_StyleSelector[6])(&local_58,this,node.ptr);
        if ((undefined1 *)local_58.size != (undefined1 *)0x0) {
          puVar17 = (undefined1 *)0x0;
          do {
            lVar16 = CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_);
            local_78.i.d = *(Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> **)
                            (lVar16 + (long)puVar17 * 0x18);
            local_78.i.bucket = *(undefined8 *)(lVar16 + 8 + (long)puVar17 * 0x18);
            local_78.e = *(Chain ***)(lVar16 + 0x10 + (long)puVar17 * 0x18);
            if (local_78.i.d != (Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *)0x0) {
              LOCK();
              ((local_78.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
                   ((local_78.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            if (this->nameCaseSensitivity == CaseInsensitive) {
              QString::toLower_helper((QString *)&local_98);
              sVar8 = local_78.i.bucket;
              pDVar7 = local_78.i.d;
              ppCVar6 = local_98.e;
              pDVar5 = local_98.i.d;
              local_98.i.d = local_78.i.d;
              local_78.i.d = pDVar5;
              local_78.i.bucket = local_98.i.bucket;
              local_98.i.bucket = sVar8;
              local_98.e = local_78.e;
              local_78.e = ppCVar6;
              if (pDVar7 != (Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *)0x0) {
                LOCK();
                (pDVar7->ref).atomic._q_value.super___atomic_base<int>._M_i =
                     (pDVar7->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((pDVar7->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate((QArrayData *)pDVar7,2,0x10);
                }
              }
            }
            local_98.e = (Chain **)&DAT_aaaaaaaaaaaaaaaa;
            local_98.i.d = (Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *)
                           &DAT_aaaaaaaaaaaaaaaa;
            local_98.i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
            QMultiHash<QString,_QCss::StyleRule>::constFindImpl<QString>
                      (&local_98,&pSVar2[uVar14].nameIndex,(QString *)&local_78);
LAB_005e0b9f:
            ppCVar6 = local_98.e;
            if (local_98.e != (Chain **)0x0) {
              pEVar3 = (local_98.i.d)->spans[local_98.i.bucket >> 7].entries;
              bVar1 = (local_98.i.d)->spans[local_98.i.bucket >> 7].offsets
                      [(uint)local_98.i.bucket & 0x7f];
              plVar4 = *(long **)(pEVar3[bVar1].storage.data + 0x10);
              if (((Chain **)plVar4 != local_78.e) ||
                 (QVar21.m_data = *(storage_type_conflict **)(pEVar3[bVar1].storage.data + 8),
                 QVar21.m_size = (qsizetype)plVar4,
                 QVar24.m_data = (storage_type_conflict *)local_78.i.bucket,
                 QVar24.m_size = (qsizetype)plVar4, cVar9 = QtPrivate::equalStrings(QVar21,QVar24),
                 cVar9 == '\0')) goto LAB_005e0cc2;
              matchRule(this,node,&(*ppCVar6)->value,pSVar2[uVar14].origin,pSVar2[uVar14].depth,
                        &local_40);
              lVar16 = (long)*local_98.e;
              local_98.e = (Chain **)(lVar16 + 0x38);
              if (*(long *)(lVar16 + 0x38) == 0) {
                psVar10 = (storage_type_conflict *)local_98.i.bucket;
                do {
                  local_98.i.bucket = (long)psVar10 + 1;
                  if ((storage_type_conflict *)((local_98.i.d)->numBuckets - 1) == psVar10) {
                    local_98.i.d = (Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *)0x0;
                    local_98.i.bucket = 0;
                    local_98.e = (Chain **)0x0;
                    goto LAB_005e0b9f;
                  }
                  uVar18 = local_98.i.bucket >> 7;
                  psVar10 = (storage_type_conflict *)local_98.i.bucket;
                } while ((local_98.i.d)->spans[uVar18].offsets[(uint)local_98.i.bucket & 0x7f] ==
                         0xff);
                local_98.e = (Chain **)
                             ((local_98.i.d)->spans[uVar18].entries
                              [(local_98.i.d)->spans[uVar18].offsets[(uint)local_98.i.bucket & 0x7f]
                              ].storage.data + 0x18);
              }
              goto LAB_005e0b9f;
            }
LAB_005e0cc2:
            if (local_78.i.d != (Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *)0x0) {
              LOCK();
              ((local_78.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
                   ((local_78.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((local_78.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate((QArrayData *)local_78.i.d,2,0x10);
              }
            }
            puVar17 = puVar17 + 1;
          } while (puVar17 < (ulong)local_58.size);
        }
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
      }
      if (((this->medium).d.size != 0) && (pSVar2[uVar14].mediaRules.d.size != 0)) {
        uVar18 = 0;
        do {
          QVar22.m_data = (this->medium).d.ptr;
          QVar22.m_size = (this->medium).d.size;
          cVar9 = QtPrivate::QStringList_contains
                            ((QList_conflict *)(pSVar2[uVar14].mediaRules.d.ptr + uVar18),QVar22,
                             CaseInsensitive);
          if ((cVar9 != '\0') &&
             (pMVar11 = pSVar2[uVar14].mediaRules.d.ptr, pMVar11[uVar18].styleRules.d.size != 0)) {
            lVar16 = 0;
            uVar19 = 0;
            do {
              matchRule(this,node,
                        (StyleRule *)
                        ((long)&((pMVar11[uVar18].styleRules.d.ptr)->selectors).d.d + lVar16),
                        pSVar2[uVar14].origin,pSVar2[uVar14].depth,&local_40);
              uVar19 = uVar19 + 1;
              pMVar11 = pSVar2[uVar14].mediaRules.d.ptr;
              lVar16 = lVar16 + 0x38;
            } while (uVar19 < (ulong)pMVar11[uVar18].styleRules.d.size);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 < (ulong)pSVar2[uVar14].mediaRules.d.size);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < (ulong)(this->styleSheets).d.size);
    if (local_40.d.d.ptr ==
        (totally_ordered_wrapper<QMapData<std::multimap<unsigned_int,_QCss::StyleRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QCss::StyleRule>_>_>_>_*>
         )0x0) {
      asize = (_Base_ptr)0x0;
    }
    else {
      asize = *(_Base_ptr *)((long)local_40.d.d.ptr + 0x30);
    }
    QList<QCss::StyleRule>::reserve(__return_storage_ptr__,(qsizetype)asize);
    if (local_40.d.d.ptr ==
        (totally_ordered_wrapper<QMapData<std::multimap<unsigned_int,_QCss::StyleRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QCss::StyleRule>_>_>_>_*>
         )0x0) {
      tVar12.ptr = (QMapData<std::multimap<unsigned_int,_QCss::StyleRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QCss::StyleRule>_>_>_>
                    *)0x0;
    }
    else {
      tVar12.ptr = *(QMapData<std::multimap<unsigned_int,_QCss::StyleRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QCss::StyleRule>_>_>_>
                     **)((long)local_40.d.d.ptr + 0x20);
    }
    pQVar15 = (QMapData<std::multimap<unsigned_int,_QCss::StyleRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QCss::StyleRule>_>_>_>
               *)((long)local_40.d.d.ptr + 0x10);
    if (local_40.d.d.ptr ==
        (totally_ordered_wrapper<QMapData<std::multimap<unsigned_int,_QCss::StyleRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QCss::StyleRule>_>_>_>_*>
         )0x0) {
      pQVar15 = (QMapData<std::multimap<unsigned_int,_QCss::StyleRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QCss::StyleRule>_>_>_>
                 *)0x0;
    }
    if (tVar12.ptr != pQVar15) {
      do {
        QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
                  ((QMovableArrayOps<QCss::StyleRule> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,
                   (StyleRule *)
                   &((tVar12.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
        QList<QCss::StyleRule>::end(__return_storage_ptr__);
        tVar12.ptr = (QMapData<std::multimap<unsigned_int,_QCss::StyleRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QCss::StyleRule>_>_>_>
                      *)std::_Rb_tree_increment(tVar12.ptr);
        QVar13.d.d.ptr = local_40.d.d.ptr;
        if (local_40.d.d.ptr !=
            (totally_ordered_wrapper<QMapData<std::multimap<unsigned_int,_QCss::StyleRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QCss::StyleRule>_>_>_>_*>
             )0x0) {
          QVar13.d.d.ptr =
               (QExplicitlySharedDataPointerV2<QMapData<std::multimap<unsigned_int,_QCss::StyleRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QCss::StyleRule>_>_>_>_>
                )(totally_ordered_wrapper<QMapData<std::multimap<unsigned_int,_QCss::StyleRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QCss::StyleRule>_>_>_>_*>
                  )((long)local_40.d.d.ptr + 0x10);
        }
      } while ((QExplicitlySharedDataPointerV2<QMapData<std::multimap<unsigned_int,_QCss::StyleRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QCss::StyleRule>_>_>_>_>
                )tVar12.ptr != QVar13.d.d.ptr);
    }
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::multimap<unsigned_int,_QCss::StyleRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QCss::StyleRule>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2(&local_40.d);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<StyleRule> StyleSelector::styleRulesForNode(NodePtr node)
{
    QList<StyleRule> rules;
    if (styleSheets.isEmpty())
        return rules;

    QMultiMap<uint, StyleRule> weightedRules; // (spec, rule) that will be sorted below

    //prune using indexed stylesheet
    for (int sheetIdx = 0; sheetIdx < styleSheets.size(); ++sheetIdx) {
        const StyleSheet &styleSheet = styleSheets.at(sheetIdx);
        for (int i = 0; i < styleSheet.styleRules.size(); ++i) {
            matchRule(node, styleSheet.styleRules.at(i), styleSheet.origin, styleSheet.depth, &weightedRules);
        }

        if (!styleSheet.idIndex.isEmpty()) {
            QStringList ids = nodeIds(node);
            for (int i = 0; i < ids.size(); i++) {
                const QString &key = ids.at(i);
                QMultiHash<QString, StyleRule>::const_iterator it = styleSheet.idIndex.constFind(key);
                while (it != styleSheet.idIndex.constEnd() && it.key() == key) {
                    matchRule(node, it.value(), styleSheet.origin, styleSheet.depth, &weightedRules);
                    ++it;
                }
            }
        }
        if (!styleSheet.nameIndex.isEmpty()) {
            QStringList names = nodeNames(node);
            for (int i = 0; i < names.size(); i++) {
                QString name = names.at(i);
                if (nameCaseSensitivity == Qt::CaseInsensitive)
                    name = std::move(name).toLower();
                QMultiHash<QString, StyleRule>::const_iterator it = styleSheet.nameIndex.constFind(name);
                while (it != styleSheet.nameIndex.constEnd() && it.key() == name) {
                    matchRule(node, it.value(), styleSheet.origin, styleSheet.depth, &weightedRules);
                    ++it;
                }
            }
        }
        if (!medium.isEmpty()) {
            for (int i = 0; i < styleSheet.mediaRules.size(); ++i) {
                if (styleSheet.mediaRules.at(i).media.contains(medium, Qt::CaseInsensitive)) {
                    for (int j = 0; j < styleSheet.mediaRules.at(i).styleRules.size(); ++j) {
                        matchRule(node, styleSheet.mediaRules.at(i).styleRules.at(j), styleSheet.origin,
                               styleSheet.depth, &weightedRules);
                    }
                }
            }
        }
    }

    rules.reserve(weightedRules.size());
    QMultiMap<uint, StyleRule>::const_iterator it = weightedRules.constBegin();
    for ( ; it != weightedRules.constEnd() ; ++it)
        rules += *it;

    return rules;
}